

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte bVar2;
  string *psVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string c_name;
  string php_name;
  undefined1 local_f8 [24];
  code *apcStack_e0 [2];
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_f8._0_8_ = (pointer)0x1;
  local_f8._8_8_ = ".";
  local_f8._16_8_ = 1;
  apcStack_e0[0] = (code *)0x46ac7d;
  absl::lts_20240722::StrReplaceAll_abi_cxx11_
            (&local_90,*(undefined8 *)(*(long *)(message + 8) + 0x28),
             *(undefined8 *)(*(long *)(message + 8) + 0x20),local_f8,1);
  local_f8._16_8_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = 0;
  apcStack_e0[1] = (code *)0x0;
  apcStack_e0[0] = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  FullClassName<google::protobuf::Descriptor>(&local_b0,message,(Options *)local_f8);
  local_50 = 1;
  local_48 = "\\";
  local_40 = 2;
  local_38 = "\\\\";
  absl::lts_20240722::StrReplaceAll_abi_cxx11_
            (&local_70,local_b0._M_string_length,local_b0._M_dataplus._M_p,&local_50,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_f8 + 8));
  local_f8._0_8_ = (pointer)0x1;
  local_f8._8_8_ = ".";
  local_f8._16_8_ = 1;
  apcStack_e0[0] = (code *)0x46ac7d;
  apcStack_e0[1] = (code *)0x1;
  local_d0 = "/";
  local_c8 = 1;
  local_c0 = "_";
  absl::lts_20240722::StrReplaceAll_abi_cxx11_
            (&local_b0,(*(undefined8 **)(*(long *)(message + 0x10) + 8))[1],
             **(undefined8 **)(*(long *)(message + 0x10) + 8),(string *)local_f8,2);
  pcVar4 = "file_c_name";
  pbVar7 = &local_b0;
  text._M_str = 
  "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
  ;
  text._M_len = 0xbc;
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,text,(char (*) [12])"file_c_name",pbVar7,(char (*) [7])0x465e87,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)(message + 4)) {
    lVar8 = 8;
    lVar5 = 0;
    do {
      pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (*(long *)(message + 0x38) + lVar8);
      name._M_str = pcVar4;
      name._M_len = (size_t)(pbVar1->_M_dataplus)._M_p;
      (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_f8,(_anonymous_namespace_ *)pbVar1->_M_string_length,name,
                 SUB81(pbVar7,0));
      pcVar4 = "c_name";
      pbVar7 = &local_90;
      text_00._M_str =
           "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n      intern->desc->msgdef, \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
      ;
      text_00._M_len = 0x273;
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_00,(char (*) [7])0x465e87,pbVar7,(char (*) [5])0x467b4f,pbVar1,
                 (char (*) [11])0x3edbac,(string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar5 < *(int *)(message + 4));
  }
  if (0 < *(int *)(message + 0x7c)) {
    lVar5 = 8;
    lVar8 = 0;
    do {
      if (*(int *)(message + 0x78) <= lVar8) {
        psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar8,(long)*(int *)(message + 0x78),"index < oneof_decl_count()");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0x9f5,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
        goto LAB_002ef12d;
      }
      pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (*(long *)(message + 0x40) + lVar5);
      name_00._M_str = pcVar4;
      name_00._M_len = (size_t)(pbVar1->_M_dataplus)._M_p;
      (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_f8,(_anonymous_namespace_ *)pbVar1->_M_string_length,name_00,
                 SUB81(pbVar7,0));
      pcVar4 = "c_name";
      pbVar7 = &local_90;
      text_01._M_str =
           "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n      intern->desc->msgdef, \"$name$\");\n  const upb_FieldDef *field = \n      upb_Message_WhichOneofByDef(intern->msg, oneof);\n  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n}\n"
      ;
      text_01._M_len = 0x156;
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_01,(char (*) [7])0x465e87,pbVar7,(char (*) [5])0x467b4f,pbVar1,
                 (char (*) [11])0x3edbac,(string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x38;
    } while (lVar8 < *(int *)(message + 0x7c));
  }
  bVar2 = (byte)message[1] >> 2 & 0x1f;
  if (bVar2 == 10) {
    pcVar4 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
    ;
    sVar6 = 0x5b;
LAB_002eee59:
    text_02._M_str = pcVar4;
    text_02._M_len = sVar6;
    io::Printer::Print<>(printer,text_02);
  }
  else if (bVar2 == 0xd) {
    pcVar4 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
    ;
    sVar6 = 0x72;
    goto LAB_002eee59;
  }
  pcVar4 = "c_name";
  pbVar7 = &local_90;
  text_03._M_str =
       "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
  ;
  text_03._M_len = 0x79;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_03,(char (*) [7])0x465e87,pbVar7);
  if (0 < *(int *)(message + 4)) {
    lVar8 = 8;
    lVar5 = 0;
    do {
      name_01._M_str = pcVar4;
      name_01._M_len = **(size_t **)(*(long *)(message + 0x38) + lVar8);
      (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_f8,
                 (_anonymous_namespace_ *)(*(size_t **)(*(long *)(message + 0x38) + lVar8))[1],
                 name_01,SUB81(pbVar7,0));
      pcVar4 = "c_name";
      text_04._M_str =
           "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
      ;
      text_04._M_len = 0x88;
      pbVar7 = &local_90;
      io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_04,(char (*) [7])0x465e87,&local_90,(char (*) [11])0x3edbac,
                 (string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar5 < *(int *)(message + 4));
  }
  if (0 < *(int *)(message + 0x7c)) {
    lVar8 = 8;
    lVar5 = 0;
    do {
      if (*(int *)(message + 0x78) <= lVar5) {
        psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar5,(long)*(int *)(message + 0x78),"index < oneof_decl_count()");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0x9f5,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
LAB_002ef12d:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_f8);
      }
      name_02._M_str = pcVar4;
      name_02._M_len = **(size_t **)(*(long *)(message + 0x40) + lVar8);
      (anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
                ((string *)local_f8,
                 (_anonymous_namespace_ *)(*(size_t **)(*(long *)(message + 0x40) + lVar8))[1],
                 name_02,SUB81(pbVar7,0));
      pcVar4 = "c_name";
      text_05._M_str = "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n";
      text_05._M_len = 0x43;
      pbVar7 = &local_90;
      io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_05,(char (*) [7])0x465e87,&local_90,(char (*) [11])0x3edbac,
                 (string *)local_f8);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x38;
    } while (lVar5 < *(int *)(message + 0x7c));
  }
  bVar2 = (byte)message[1] >> 2 & 0x1f;
  if (bVar2 == 10) {
    pcVar4 = 
    "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
    sVar6 = 0xa8;
  }
  else {
    if (bVar2 != 0xd) goto LAB_002eefe2;
    pcVar4 = 
    "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
    sVar6 = 0x90;
  }
  text_06._M_str = pcVar4;
  text_06._M_len = sVar6;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_06,(char (*) [7])0x465e87,&local_90)
  ;
LAB_002eefe2:
  text_07._M_str =
       "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
  ;
  text_07._M_len = 0x169;
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,text_07,(char (*) [7])0x465e87,&local_90,(char (*) [9])"php_name",&local_70);
  if (0 < *(int *)(message + 0x80)) {
    lVar8 = 0;
    lVar5 = 0;
    do {
      GenerateCMessage((Descriptor *)(*(long *)(message + 0x48) + lVar8),printer);
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x98;
    } while (lVar5 < *(int *)(message + 0x80));
  }
  if (0 < *(int *)(message + 0x84)) {
    lVar8 = 0;
    lVar5 = 0;
    do {
      GenerateCEnum((EnumDescriptor *)(*(long *)(message + 0x50) + lVar8),printer);
      lVar5 = lVar5 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar5 < *(int *)(message + 0x84));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(message->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(message, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()), "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval ret;\n"
        "  Message_get(intern, f, &ret);\n"
        "  RETURN_COPY_VALUE(&ret);\n"
        "}\n"
        "\n"
        "static PHP_METHOD($c_name$, set$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_FieldDef *f = upb_MessageDef_FindFieldByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  zval *val;\n"
        "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
        "      == FAILURE) {\n"
        "    return;\n"
        "  }\n"
        "  Message_set(intern, f, val);\n"
        "  RETURN_COPY(getThis());\n"
        "}\n"
        "\n",
        "c_name", c_name, "name", field->name(), "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "static PHP_METHOD($c_name$, get$camel_name$) {\n"
        "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
        "  const upb_OneofDef *oneof = upb_MessageDef_FindOneofByName(\n"
        "      intern->desc->msgdef, \"$name$\");\n"
        "  const upb_FieldDef *field = \n"
        "      upb_Message_WhichOneofByDef(intern->msg, oneof);\n"
        "  RETURN_STRING(field ? upb_FieldDef_Name(field) : \"\");\n"
        "}\n",
        "c_name", c_name, "name", oneof->name(), "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n");
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, "
        "ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
        "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name, "camel_name",
        UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, "
          "ZEND_ACC_PUBLIC)\n"
          "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
          "c_name", c_name);
      break;
    default:
      break;
  }

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}